

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifLibLut.c
# Opt level: O2

void If_LibLutPrint(If_LibLut_t *pLutLib)

{
  ulong uVar1;
  float *pfVar2;
  ulong uVar3;
  float (*pafVar4) [33];
  
  Abc_Print(1,"# The area/delay of k-variable LUTs:\n");
  Abc_Print(1,"# k    area     delay\n");
  if (pLutLib->fVarPinDelays == 0) {
    pafVar4 = pLutLib->pLutDelays;
    pfVar2 = pLutLib->pLutAreas;
    for (uVar3 = 1; pfVar2 = pfVar2 + 1, pafVar4 = pafVar4 + 1, (long)uVar3 <= (long)pLutLib->LutMax
        ; uVar3 = uVar3 + 1) {
      Abc_Print(1,"%d   %7.2f   %7.2f\n",(double)*pfVar2,(double)(*pafVar4)[0],uVar3 & 0xffffffff);
    }
  }
  else {
    pafVar4 = pLutLib->pLutDelays;
    for (uVar3 = 1; pafVar4 = pafVar4 + 1, (long)uVar3 <= (long)pLutLib->LutMax; uVar3 = uVar3 + 1)
    {
      Abc_Print(1,"%d   %7.2f  ",(double)pLutLib->pLutAreas[uVar3],uVar3 & 0xffffffff);
      for (uVar1 = 0; uVar3 != uVar1; uVar1 = uVar1 + 1) {
        Abc_Print(1," %7.2f",(double)(*pafVar4)[uVar1]);
      }
      Abc_Print(1,"\n");
    }
  }
  return;
}

Assistant:

void If_LibLutPrint( If_LibLut_t * pLutLib )
{
    int i, k;
    Abc_Print( 1, "# The area/delay of k-variable LUTs:\n" );
    Abc_Print( 1, "# k    area     delay\n" );
    if ( pLutLib->fVarPinDelays )
    {
        for ( i = 1; i <= pLutLib->LutMax; i++ )
        {
            Abc_Print( 1, "%d   %7.2f  ", i, pLutLib->pLutAreas[i] );
            for ( k = 0; k < i; k++ )
                Abc_Print( 1, " %7.2f", pLutLib->pLutDelays[i][k] );
            Abc_Print( 1, "\n" );
        }
    }
    else
        for ( i = 1; i <= pLutLib->LutMax; i++ )
            Abc_Print( 1, "%d   %7.2f   %7.2f\n", i, pLutLib->pLutAreas[i], pLutLib->pLutDelays[i][0] );
}